

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_map.c
# Opt level: O0

size_t log_map_hash_fnv1(char *key)

{
  char *iterator;
  size_t hash;
  char *key_local;
  
  hash = 0x811c9dc5;
  for (iterator = key; *iterator != '\0'; iterator = iterator + 1) {
    hash = hash * 0x1000193 ^ (long)*iterator;
  }
  return hash;
}

Assistant:

static size_t log_map_hash_fnv1(const char *key)
{
	size_t hash = ((size_t)0x811C9DC5);

	const char *iterator = key;

	while (*iterator != '\0')
	{
		hash = (((size_t)0x01000193) * hash) ^ (*iterator);

		++iterator;
	}

	return hash;
}